

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void DeserializeHDKeypaths<DataStream>
               (DataStream *s,vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
               map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
               *hd_keypaths)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  KeyOriginInfo keypath;
  CPubKey pubkey;
  KeyOriginInfo *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  io_errc in_stack_fffffffffffffeb4;
  KeyOriginInfo *in_stack_fffffffffffffeb8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffec0;
  CPubKey *__args;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffec8;
  CPubKey local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffea8);
  if (sVar2 != 0x42) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffea8);
    if (sVar2 != 0x22) {
      pcVar3 = (char *)__cxa_allocate_exception(0x20);
      std::error_code::error_code<std::io_errc,void>
                ((error_code *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar3,(error_code *)
                        "Size of key was not the expected size for the type BIP32 keypath");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_006adf74;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  __gnu_cxx::
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)in_stack_fffffffffffffeb8,
              CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  CPubKey::
  CPubKey<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((CPubKey *)in_stack_fffffffffffffea8,in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec0);
  bVar1 = CPubKey::IsFullyValid((CPubKey *)in_stack_fffffffffffffec0._M_current);
  if (bVar1) {
    sVar4 = std::
            map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
            ::count((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
                     *)in_stack_fffffffffffffeb8,
                    (key_type *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    if (sVar4 == 0) {
      __args = &local_70;
      KeyOriginInfo::KeyOriginInfo(in_stack_fffffffffffffea8);
      DeserializeHDKeypath<DataStream>
                ((DataStream *)in_stack_fffffffffffffeb8,
                 (KeyOriginInfo *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      std::
      map<CPubKey,KeyOriginInfo,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
      ::emplace<CPubKey&,KeyOriginInfo>
                ((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
                  *)in_stack_fffffffffffffec8._M_current,__args,in_stack_fffffffffffffeb8);
      KeyOriginInfo::~KeyOriginInfo(in_stack_fffffffffffffea8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
    }
    else {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      pcVar3 = pcVar5;
      std::error_code::error_code<std::io_errc,void>
                ((error_code *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar5,(error_code *)"Duplicate Key, pubkey derivation path already provided");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
  }
  else {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              ((error_code *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
    std::ios_base::failure[abi:cxx11]::failure(pcVar3,(error_code *)"Invalid pubkey");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_006adf74:
  __stack_chk_fail();
}

Assistant:

void DeserializeHDKeypaths(Stream& s, const std::vector<unsigned char>& key, std::map<CPubKey, KeyOriginInfo>& hd_keypaths)
{
    // Make sure that the key is the size of pubkey + 1
    if (key.size() != CPubKey::SIZE + 1 && key.size() != CPubKey::COMPRESSED_SIZE + 1) {
        throw std::ios_base::failure("Size of key was not the expected size for the type BIP32 keypath");
    }
    // Read in the pubkey from key
    CPubKey pubkey(key.begin() + 1, key.end());
    if (!pubkey.IsFullyValid()) {
       throw std::ios_base::failure("Invalid pubkey");
    }
    if (hd_keypaths.count(pubkey) > 0) {
        throw std::ios_base::failure("Duplicate Key, pubkey derivation path already provided");
    }

    KeyOriginInfo keypath;
    DeserializeHDKeypath(s, keypath);

    // Add to map
    hd_keypaths.emplace(pubkey, std::move(keypath));
}